

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::NormalizerSpec::NormalizerSpec(NormalizerSpec *this,NormalizerSpec *from)

{
  bool bVar1;
  InternalMetadata *this_00;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar2;
  string *psVar3;
  Arena *pAVar4;
  NormalizerSpec *from_local;
  NormalizerSpec *this_local;
  string *local_28;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)0x0;
  (this->super_MessageLite)._internal_metadata_.ptr_ = (void *)0x0;
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NormalizerSpec_0039d520;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  this_00 = &(from->super_MessageLite)._internal_metadata_;
  if (((uint)this_00->ptr_ & 1) == 1) {
    if (((uint)this_00->ptr_ & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         (this_00);
      local_28 = &pCVar2->unknown_fields;
    }
    else {
      local_28 = (string *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,local_28);
  }
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,psVar3);
  bVar1 = _internal_has_name(from);
  if (bVar1) {
    psVar3 = _internal_name_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->name_,psVar3,pAVar4);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->precompiled_charsmap_,psVar3);
  bVar1 = _internal_has_precompiled_charsmap(from);
  if (bVar1) {
    psVar3 = _internal_precompiled_charsmap_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->precompiled_charsmap_,psVar3,pAVar4);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->normalization_rule_tsv_,psVar3);
  bVar1 = _internal_has_normalization_rule_tsv(from);
  if (bVar1) {
    psVar3 = _internal_normalization_rule_tsv_abi_cxx11_(from);
    pAVar4 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->normalization_rule_tsv_,psVar3,pAVar4);
  }
  memcpy(&this->add_dummy_prefix_,&from->add_dummy_prefix_,3);
  return;
}

Assistant:

NormalizerSpec::NormalizerSpec(const NormalizerSpec& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_name(), 
      GetArena());
  }
  precompiled_charsmap_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_precompiled_charsmap()) {
    precompiled_charsmap_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_precompiled_charsmap(), 
      GetArena());
  }
  normalization_rule_tsv_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_normalization_rule_tsv()) {
    normalization_rule_tsv_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_normalization_rule_tsv(), 
      GetArena());
  }
  ::memcpy(&add_dummy_prefix_, &from.add_dummy_prefix_,
    static_cast<size_t>(reinterpret_cast<char*>(&escape_whitespaces_) -
    reinterpret_cast<char*>(&add_dummy_prefix_)) + sizeof(escape_whitespaces_));
  // @@protoc_insertion_point(copy_constructor:sentencepiece.NormalizerSpec)
}